

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

uint64_t helper_macmulu_m68k(CPUM68KState_conflict *env,uint32_t op1,uint32_t op2)

{
  uint uVar1;
  uint64_t uVar2;
  
  uVar2 = (ulong)op2 * (ulong)op1;
  if (0xffffffffff < uVar2) {
    uVar1 = env->macsr;
    env->macsr = uVar1 | 2;
    uVar2 = uVar2 & 0xffffffffff;
    if ((char)uVar1 < '\0') {
      uVar2 = 0x4000000000000;
    }
  }
  return uVar2;
}

Assistant:

uint64_t HELPER(macmulu)(CPUM68KState *env, uint32_t op1, uint32_t op2)
{
    uint64_t product;

    product = (uint64_t)op1 * op2;
    if (product & (0xffffffull << 40)) {
        env->macsr |= MACSR_V;
        if (env->macsr & MACSR_OMC) {
            /* Make sure the accumulate operation overflows.  */
            product = 1ll << 50;
        } else {
            product &= ((1ull << 40) - 1);
        }
    }
    return product;
}